

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void processEvent(XEvent *event)

{
  unsigned_short *puVar1;
  long lVar2;
  Atom AVar3;
  undefined8 uVar4;
  Atom AVar5;
  Atom AVar6;
  Atom AVar7;
  Window window_00;
  Atom AVar8;
  _GLFWmonitor *p_Var9;
  undefined4 uVar10;
  wchar_t wVar11;
  int iVar12;
  unsigned_long uVar13;
  double dVar14;
  double dVar15;
  double local_338;
  double y_2;
  double x_2;
  XIDeviceEvent *data_1;
  undefined4 local_318;
  int state;
  XEvent reply_1;
  char **paths;
  int local_248;
  wchar_t count_1;
  wchar_t i_1;
  int result;
  char *data;
  XEvent reply;
  wchar_t y_1;
  wchar_t x_1;
  int absY;
  int absX;
  int y;
  int x;
  int mods_3;
  int mods_2;
  XEvent nextEvent;
  int mods_1;
  int key_1;
  long character;
  KeySym keysym;
  uint local_78;
  int count;
  wchar_t buffer [16];
  undefined1 local_2c [4];
  int local_28;
  wchar_t status;
  wchar_t i;
  int plain;
  int mods;
  int key;
  _GLFWwindow *window;
  XEvent *event_local;
  
  _mods = (_GLFWwindow *)0x0;
  window = (_GLFWwindow *)event;
  if ((event->type == 0x23) ||
     (_mods = findWindowByHandle((event->xany).window), _mods != (_GLFWwindow *)0x0)) {
    switch(*(undefined4 *)&window->next) {
    case 2:
      plain = translateKey(*(wchar_t *)((long)&window->cursorPosY + 4));
      i = translateState(*(wchar_t *)&window->cursorPosY);
      status = (wchar_t)(((i & 6U) != 0U ^ 0xffU) & 1);
      if (*(int *)((long)&window->cursorPosY + 4) != 0) {
        _glfwInputKey(_mods,plain,*(int *)((long)&window->cursorPosY + 4),1,i);
      }
      if ((_mods->x11).ic == (XIC)0x0) {
        XLookupString(window,0,0,&character);
        _mods_1 = _glfwKeySym2Unicode((uint)character);
        if (_mods_1 != -1) {
          _glfwInputChar(_mods,(uint)_mods_1,i,status);
        }
      }
      else {
        iVar12 = XFilterEvent(window,0);
        if (iVar12 == 0) {
          keysym._4_4_ = XwcLookupString((_mods->x11).ic,window,&local_78,0x40,0,local_2c);
          for (local_28 = 0; local_28 < keysym._4_4_; local_28 = local_28 + 1) {
            _glfwInputChar(_mods,(&local_78)[local_28],i,status);
          }
        }
      }
      break;
    case 3:
      nextEvent.pad[0x17]._4_4_ = translateKey(*(wchar_t *)((long)&window->cursorPosY + 4));
      nextEvent.pad[0x17]._0_4_ = translateState(*(wchar_t *)&window->cursorPosY);
      if (((((_glfw.x11.xkb.detectable != '\0') ||
            (iVar12 = XEventsQueued(_glfw.x11.display,1), iVar12 == 0)) ||
           (XPeekEvent(_glfw.x11.display,&mods_3), mods_3 != 2)) ||
          ((nextEvent.xany.display != *(Display **)&(window->videoMode).redBits ||
           (nextEvent.xkey.y_root != *(int *)((long)&window->cursorPosY + 4))))) ||
         (0x13 < (ulong)((long)nextEvent.xcookie.data - (long)window->cursor))) {
        _glfwInputKey(_mods,nextEvent.pad[0x17]._4_4_,*(int *)((long)&window->cursorPosY + 4),0,
                      nextEvent.pad[0x17]._0_4_);
      }
      break;
    case 4:
      x = translateState(*(wchar_t *)&window->cursorPosY);
      if (*(int *)((long)&window->cursorPosY + 4) == 1) {
        _glfwInputMouseClick(_mods,0,1,x);
      }
      else if (*(int *)((long)&window->cursorPosY + 4) == 2) {
        _glfwInputMouseClick(_mods,2,1,x);
      }
      else if (*(int *)((long)&window->cursorPosY + 4) == 3) {
        _glfwInputMouseClick(_mods,1,1,x);
      }
      else if (*(int *)((long)&window->cursorPosY + 4) == 4) {
        _glfwInputScroll(_mods,0.0,1.0);
      }
      else if (*(int *)((long)&window->cursorPosY + 4) == 5) {
        _glfwInputScroll(_mods,0.0,-1.0);
      }
      else if (*(int *)((long)&window->cursorPosY + 4) == 6) {
        _glfwInputScroll(_mods,1.0,0.0);
      }
      else if (*(int *)((long)&window->cursorPosY + 4) == 7) {
        _glfwInputScroll(_mods,-1.0,0.0);
      }
      else {
        _glfwInputMouseClick(_mods,*(int *)((long)&window->cursorPosY + 4) + -5,1,x);
      }
      break;
    case 5:
      y = translateState(*(wchar_t *)&window->cursorPosY);
      if (*(int *)((long)&window->cursorPosY + 4) == 1) {
        _glfwInputMouseClick(_mods,0,0,y);
      }
      else if (*(int *)((long)&window->cursorPosY + 4) == 2) {
        _glfwInputMouseClick(_mods,2,0,y);
      }
      else if (*(int *)((long)&window->cursorPosY + 4) == 3) {
        _glfwInputMouseClick(_mods,1,0,y);
      }
      else if (7 < *(uint *)((long)&window->cursorPosY + 4)) {
        _glfwInputMouseClick(_mods,*(int *)((long)&window->cursorPosY + 4) + -4,0,y);
      }
      break;
    case 6:
      absX._0_1_ = window->stickyKeys;
      absX._1_1_ = window->stickyMouseButtons;
      absX._2_2_ = *(undefined2 *)&window->field_0x42;
      absY = *(int *)&window->field_0x44;
      if ((absX != (_mods->x11).warpPosX) || (absY != (_mods->x11).warpPosY)) {
        if (_mods->cursorMode == 0x34003) {
          if (_glfw.focusedWindow != _mods) {
            return;
          }
          _glfwInputCursorMotion
                    (_mods,(double)absX - (_mods->x11).cursorPosX,
                     (double)absY - (_mods->x11).cursorPosY);
        }
        else {
          _glfwInputCursorMotion(_mods,(double)absX,(double)absY);
        }
      }
      (_mods->x11).cursorPosX = (double)absX;
      (_mods->x11).cursorPosY = (double)absY;
      break;
    case 7:
      if (_mods->cursorMode == 0x34002) {
        hideCursor(_mods);
      }
      _glfwInputCursorEnter(_mods,1);
      break;
    case 8:
      _glfwInputCursorEnter(_mods,0);
      break;
    case 9:
      if (((window->videoMode).blueBits == 0) &&
         (_glfwInputWindowFocus(_mods,'\x01'), _mods->cursorMode == 0x34003)) {
        disableCursor(_mods);
      }
      break;
    case 10:
      if (((window->videoMode).blueBits == 0) &&
         (_glfwInputWindowFocus(_mods,'\0'), _mods->cursorMode == 0x34003)) {
        restoreCursor(_mods);
      }
      break;
    default:
      if (*(int *)&window->next == _glfw.x11.randr.eventBase) {
        XRRUpdateConfiguration(window);
      }
      break;
    case 0xc:
      _glfwInputWindowDamage(_mods);
      break;
    case 0x11:
      break;
    case 0x16:
      if ((*(int *)&window->cursor != (_mods->x11).width) ||
         (*(int *)((long)&window->cursor + 4) != (_mods->x11).height)) {
        _glfwInputFramebufferSize(_mods,*(int *)&window->cursor,*(int *)((long)&window->cursor + 4))
        ;
        _glfwInputWindowSize(_mods,*(int *)&window->cursor,*(int *)((long)&window->cursor + 4));
        (_mods->x11).width = *(int *)&window->cursor;
        (_mods->x11).height = *(int *)((long)&window->cursor + 4);
      }
      if ((*(int *)&window->monitor != (_mods->x11).xpos) ||
         (*(int *)((long)&window->monitor + 4) != (_mods->x11).ypos)) {
        _glfwInputWindowPos(_mods,*(int *)&window->monitor,*(int *)((long)&window->monitor + 4));
        (_mods->x11).xpos = *(int *)&window->monitor;
        (_mods->x11).ypos = *(int *)((long)&window->monitor + 4);
      }
      break;
    case 0x1c:
      AVar8._0_4_ = (window->videoMode).blueBits;
      AVar8._4_4_ = (window->videoMode).refreshRate;
      if ((AVar8 == _glfw.x11.WM_STATE) && (*(int *)&window->cursor == 0)) {
        wVar11 = getWindowState(_mods);
        if (wVar11 == L'\x03') {
          _glfwInputWindowIconify(_mods,1);
        }
        else if (wVar11 == L'\x01') {
          _glfwInputWindowIconify(_mods,0);
        }
      }
      break;
    case 0x1d:
      handleSelectionClear((XEvent *)window);
      break;
    case 0x1e:
      handleSelectionRequest((XEvent *)window);
      break;
    case 0x1f:
      if (window->cursor != (_GLFWcursor *)0x0) {
        window_00._0_4_ = (window->videoMode).redBits;
        window_00._4_4_ = (window->videoMode).greenBits;
        uVar13 = _glfwGetWindowProperty
                           (window_00,(Atom)window->cursor,(Atom)window->monitor,(uchar **)&i_1);
        count_1 = (wchar_t)uVar13;
        if (count_1 != L'\0') {
          reply_1.pad[0x17] = (long)parseUriList((char *)_i_1,(int *)((long)&paths + 4));
          _glfwInputDrop(_mods,paths._4_4_,(char **)reply_1.pad[0x17]);
          for (local_248 = 0; local_248 < paths._4_4_; local_248 = local_248 + 1) {
            free(*(void **)(reply_1.pad[0x17] + (long)local_248 * 8));
          }
          free((void *)reply_1.pad[0x17]);
        }
        XFree(_i_1);
        memset(&local_318,0,0xc0);
        local_318 = 0x21;
        reply_1.xany.display = (Display *)_glfw.x11.xdnd.source;
        reply_1.xany.window = _glfw.x11.XdndFinished;
        reply_1.xfocus.mode = 0x20;
        reply_1.xkey.subwindow = (_mods->x11).handle;
        reply_1.xkey.time = (Time)count_1;
        reply_1.xselectionrequest.property = _glfw.x11.XdndActionCopy;
        XSendEvent(_glfw.x11.display,_glfw.x11.xdnd.source,0,0,&local_318);
        XFlush(_glfw.x11.display);
      }
      break;
    case 0x21:
      lVar2._0_4_ = (window->videoMode).blueBits;
      lVar2._4_4_ = (window->videoMode).refreshRate;
      if (lVar2 != 0) {
        AVar3._0_4_ = (window->videoMode).blueBits;
        AVar3._4_4_ = (window->videoMode).refreshRate;
        if (AVar3 == _glfw.x11.WM_PROTOCOLS) {
          if ((_glfw.x11.WM_DELETE_WINDOW == 0) ||
             (window->cursor != (_GLFWcursor *)_glfw.x11.WM_DELETE_WINDOW)) {
            if ((_glfw.x11.NET_WM_PING != 0) &&
               (window->cursor == (_GLFWcursor *)_glfw.x11.NET_WM_PING)) {
              uVar10 = _glfw.x11.root._4_4_;
              (window->videoMode).redBits = (undefined4)_glfw.x11.root;
              (window->videoMode).greenBits = uVar10;
              uVar4._0_4_ = (window->videoMode).redBits;
              uVar4._4_4_ = (window->videoMode).greenBits;
              XSendEvent(_glfw.x11.display,uVar4,0,0x180000,window);
            }
          }
          else {
            _glfwInputWindowCloseRequest(_mods);
          }
        }
        else {
          AVar5._0_4_ = (window->videoMode).blueBits;
          AVar5._4_4_ = (window->videoMode).refreshRate;
          if (AVar5 != _glfw.x11.XdndEnter) {
            AVar6._0_4_ = (window->videoMode).blueBits;
            AVar6._4_4_ = (window->videoMode).refreshRate;
            if (AVar6 == _glfw.x11.XdndDrop) {
              _glfw.x11.xdnd.source = (Window)window->cursor;
              XConvertSelection(_glfw.x11.display,_glfw.x11.XdndSelection,_glfw.x11.UTF8_STRING,
                                _glfw.x11.XdndSelection,(_mods->x11).handle,0);
            }
            else {
              AVar7._0_4_ = (window->videoMode).blueBits;
              AVar7._4_4_ = (window->videoMode).refreshRate;
              if (AVar7 == _glfw.x11.XdndPosition) {
                x_1 = (uint)((ulong)window->cursorPosX >> 0x10) & 0xffff;
                y_1 = SUB84(window->cursorPosX,0) & 0xffff;
                _glfwPlatformGetWindowPos
                          (_mods,(int *)((long)&reply + 0xbc),(int *)(reply.pad + 0x17));
                _glfwInputCursorMotion
                          (_mods,(double)(x_1 - reply._188_4_),(double)(y_1 - reply._184_4_));
                memset(&data,0,0xc0);
                data._0_4_ = 0x21;
                reply.xany.display = (Display *)window->cursor;
                reply.xany.window = _glfw.x11.XdndStatus;
                reply.xfocus.mode = 0x20;
                reply.xkey.subwindow = (_mods->x11).handle;
                reply.xkey.time = 1;
                reply.xselectionrequest.property = 0;
                reply.xconfigure.above = 0;
                reply.pad[10] = _glfw.x11.XdndActionCopy;
                XSendEvent(_glfw.x11.display,window->cursor,0,0,&data);
                XFlush(_glfw.x11.display);
              }
            }
          }
        }
      }
      break;
    case 0x23:
      if ((((window->videoMode).redBits == _glfw.x11.xi.majorOpcode) &&
          (iVar12 = XGetEventData(_glfw.x11.display,window), iVar12 != 0)) &&
         ((window->videoMode).greenBits == 6)) {
        p_Var9 = window->monitor;
        _mods = findWindowByHandle((Window)(p_Var9->originalRamp).blue);
        if (_mods != (_GLFWwindow *)0x0) {
          puVar1 = (p_Var9->currentRamp).blue;
          dVar14 = (double)(_mods->x11).warpPosX;
          if ((((double)puVar1 != dVar14) || (NAN((double)puVar1) || NAN(dVar14))) ||
             ((dVar14 = *(double *)&(p_Var9->currentRamp).size,
              dVar15 = (double)(_mods->x11).warpPosY, dVar14 != dVar15 ||
              (NAN(dVar14) || NAN(dVar15))))) {
            if (_mods->cursorMode == 0x34003) {
              if (_glfw.focusedWindow != _mods) {
                return;
              }
              y_2 = (double)(p_Var9->currentRamp).blue - (_mods->x11).cursorPosX;
              local_338 = *(double *)&(p_Var9->currentRamp).size - (_mods->x11).cursorPosY;
            }
            else {
              y_2 = (double)(p_Var9->currentRamp).blue;
              local_338 = *(double *)&(p_Var9->currentRamp).size;
            }
            _glfwInputCursorMotion(_mods,y_2,local_338);
          }
          (_mods->x11).cursorPosX = (double)(p_Var9->currentRamp).blue;
          (_mods->x11).cursorPosY = *(double *)&(p_Var9->currentRamp).size;
        }
      }
      XFreeEventData(_glfw.x11.display,window);
    }
  }
  return;
}

Assistant:

static void processEvent(XEvent *event)
{
    _GLFWwindow* window = NULL;

    if (event->type != GenericEvent)
    {
        window = findWindowByHandle(event->xany.window);
        if (window == NULL)
        {
            // This is an event for a window that has already been destroyed
            return;
        }
    }

    switch (event->type)
    {
        case KeyPress:
        {
            const int key = translateKey(event->xkey.keycode);
            const int mods = translateState(event->xkey.state);
            const int plain = !(mods & (GLFW_MOD_CONTROL | GLFW_MOD_ALT));

            if (event->xkey.keycode)
                _glfwInputKey(window, key, event->xkey.keycode, GLFW_PRESS, mods);

            if (window->x11.ic)
            {
                // Translate keys to characters with XIM input context

                int i;
                Status status;
                wchar_t buffer[16];

                if (XFilterEvent(event, None))
                {
                    // Discard intermediary (dead key) events for character input
                    break;
                }

                const int count = XwcLookupString(window->x11.ic,
                                                  &event->xkey,
                                                  buffer, sizeof(buffer),
                                                  NULL, &status);

                for (i = 0;  i < count;  i++)
                    _glfwInputChar(window, buffer[i], mods, plain);
            }
            else
            {
                // Translate keys to characters with fallback lookup table

                KeySym keysym;
                XLookupString(&event->xkey, NULL, 0, &keysym, NULL);

                const long character = _glfwKeySym2Unicode(keysym);
                if (character != -1)
                    _glfwInputChar(window, character, mods, plain);
            }

            break;
        }

        case KeyRelease:
        {
            const int key = translateKey(event->xkey.keycode);
            const int mods = translateState(event->xkey.state);

            if (!_glfw.x11.xkb.detectable)
            {
                // HACK: Key repeat events will arrive as KeyRelease/KeyPress
                //       pairs with similar or identical time stamps
                //       The key repeat logic in _glfwInputKey expects only key
                //       presses to repeat, so detect and discard release events
                if (XEventsQueued(_glfw.x11.display, QueuedAfterReading))
                {
                    XEvent nextEvent;
                    XPeekEvent(_glfw.x11.display, &nextEvent);

                    if (nextEvent.type == KeyPress &&
                        nextEvent.xkey.window == event->xkey.window &&
                        nextEvent.xkey.keycode == event->xkey.keycode)
                    {
                        // HACK: Repeat events sometimes leak through due to
                        //       some sort of time drift, so add an epsilon
                        //       Toshiyuki Takahashi can press a button 16 times
                        //       per second so it's fairly safe to assume that
                        //       no human is pressing the key 50 times per
                        //       second (value is ms)
                        if ((nextEvent.xkey.time - event->xkey.time) < 20)
                        {
                            // This is very likely a server-generated key repeat
                            // event, so ignore it
                            break;
                        }
                    }
                }
            }

            _glfwInputKey(window, key, event->xkey.keycode, GLFW_RELEASE, mods);
            break;
        }

        case ButtonPress:
        {
            const int mods = translateState(event->xbutton.state);

            if (event->xbutton.button == Button1)
                _glfwInputMouseClick(window, GLFW_MOUSE_BUTTON_LEFT, GLFW_PRESS, mods);
            else if (event->xbutton.button == Button2)
                _glfwInputMouseClick(window, GLFW_MOUSE_BUTTON_MIDDLE, GLFW_PRESS, mods);
            else if (event->xbutton.button == Button3)
                _glfwInputMouseClick(window, GLFW_MOUSE_BUTTON_RIGHT, GLFW_PRESS, mods);

            // Modern X provides scroll events as mouse button presses
            else if (event->xbutton.button == Button4)
                _glfwInputScroll(window, 0.0, 1.0);
            else if (event->xbutton.button == Button5)
                _glfwInputScroll(window, 0.0, -1.0);
            else if (event->xbutton.button == Button6)
                _glfwInputScroll(window, 1.0, 0.0);
            else if (event->xbutton.button == Button7)
                _glfwInputScroll(window, -1.0, 0.0);

            else
            {
                // Additional buttons after 7 are treated as regular buttons
                // We subtract 4 to fill the gap left by scroll input above
                _glfwInputMouseClick(window,
                                     event->xbutton.button - Button1 - 4,
                                     GLFW_PRESS,
                                     mods);
            }

            break;
        }

        case ButtonRelease:
        {
            const int mods = translateState(event->xbutton.state);

            if (event->xbutton.button == Button1)
            {
                _glfwInputMouseClick(window,
                                     GLFW_MOUSE_BUTTON_LEFT,
                                     GLFW_RELEASE,
                                     mods);
            }
            else if (event->xbutton.button == Button2)
            {
                _glfwInputMouseClick(window,
                                     GLFW_MOUSE_BUTTON_MIDDLE,
                                     GLFW_RELEASE,
                                     mods);
            }
            else if (event->xbutton.button == Button3)
            {
                _glfwInputMouseClick(window,
                                     GLFW_MOUSE_BUTTON_RIGHT,
                                     GLFW_RELEASE,
                                     mods);
            }
            else if (event->xbutton.button > Button7)
            {
                // Additional buttons after 7 are treated as regular buttons
                // We subtract 4 to fill the gap left by scroll input above
                _glfwInputMouseClick(window,
                                     event->xbutton.button - 4,
                                     GLFW_RELEASE,
                                     mods);
            }
            break;
        }

        case EnterNotify:
        {
            // HACK: This is a workaround for WMs (KWM, Fluxbox) that otherwise
            //       ignore the defined cursor for hidden cursor mode
            if (window->cursorMode == GLFW_CURSOR_HIDDEN)
                hideCursor(window);

            _glfwInputCursorEnter(window, GL_TRUE);
            break;
        }

        case LeaveNotify:
        {
            _glfwInputCursorEnter(window, GL_FALSE);
            break;
        }

        case MotionNotify:
        {
            const int x = event->xmotion.x;
            const int y = event->xmotion.y;

            if (x != window->x11.warpPosX || y != window->x11.warpPosY)
            {
                // The cursor was moved by something other than GLFW

                if (window->cursorMode == GLFW_CURSOR_DISABLED)
                {
                    if (_glfw.focusedWindow != window)
                        break;

                    _glfwInputCursorMotion(window,
                                           x - window->x11.cursorPosX,
                                           y - window->x11.cursorPosY);
                }
                else
                    _glfwInputCursorMotion(window, x, y);
            }

            window->x11.cursorPosX = x;
            window->x11.cursorPosY = y;
            break;
        }

        case ConfigureNotify:
        {
            if (event->xconfigure.width != window->x11.width ||
                event->xconfigure.height != window->x11.height)
            {
                _glfwInputFramebufferSize(window,
                                          event->xconfigure.width,
                                          event->xconfigure.height);

                _glfwInputWindowSize(window,
                                     event->xconfigure.width,
                                     event->xconfigure.height);

                window->x11.width = event->xconfigure.width;
                window->x11.height = event->xconfigure.height;
            }

            if (event->xconfigure.x != window->x11.xpos ||
                event->xconfigure.y != window->x11.ypos)
            {
                _glfwInputWindowPos(window,
                                    event->xconfigure.x,
                                    event->xconfigure.y);

                window->x11.xpos = event->xconfigure.x;
                window->x11.ypos = event->xconfigure.y;
            }

            break;
        }

        case ClientMessage:
        {
            // Custom client message, probably from the window manager

            if (event->xclient.message_type == None)
                break;

            if (event->xclient.message_type == _glfw.x11.WM_PROTOCOLS)
            {
                if (_glfw.x11.WM_DELETE_WINDOW &&
                    (Atom) event->xclient.data.l[0] == _glfw.x11.WM_DELETE_WINDOW)
                {
                    // The window manager was asked to close the window, for example by
                    // the user pressing a 'close' window decoration button

                    _glfwInputWindowCloseRequest(window);
                }
                else if (_glfw.x11.NET_WM_PING &&
                        (Atom) event->xclient.data.l[0] == _glfw.x11.NET_WM_PING)
                {
                    // The window manager is pinging the application to ensure it's
                    // still responding to events

                    event->xclient.window = _glfw.x11.root;
                    XSendEvent(_glfw.x11.display,
                            event->xclient.window,
                            False,
                            SubstructureNotifyMask | SubstructureRedirectMask,
                            event);
                }
            }
            else if (event->xclient.message_type == _glfw.x11.XdndEnter)
            {
                // A drag operation has entered the window
                // TODO: Check if UTF-8 string is supported by the source
            }
            else if (event->xclient.message_type == _glfw.x11.XdndDrop)
            {
                // The drag operation has finished dropping on
                // the window, ask to convert it to a UTF-8 string
                _glfw.x11.xdnd.source = event->xclient.data.l[0];
                XConvertSelection(_glfw.x11.display,
                                  _glfw.x11.XdndSelection,
                                  _glfw.x11.UTF8_STRING,
                                  _glfw.x11.XdndSelection,
                                  window->x11.handle, CurrentTime);
            }
            else if (event->xclient.message_type == _glfw.x11.XdndPosition)
            {
                // The drag operation has moved over the window
                const int absX = (event->xclient.data.l[2] >> 16) & 0xFFFF;
                const int absY = (event->xclient.data.l[2]) & 0xFFFF;
                int x, y;

                _glfwPlatformGetWindowPos(window, &x, &y);
                _glfwInputCursorMotion(window, absX - x, absY - y);

                // Reply that we are ready to copy the dragged data
                XEvent reply;
                memset(&reply, 0, sizeof(reply));

                reply.type = ClientMessage;
                reply.xclient.window = event->xclient.data.l[0];
                reply.xclient.message_type = _glfw.x11.XdndStatus;
                reply.xclient.format = 32;
                reply.xclient.data.l[0] = window->x11.handle;
                reply.xclient.data.l[1] = 1; // Always accept the dnd with no rectangle
                reply.xclient.data.l[2] = 0; // Specify an empty rectangle
                reply.xclient.data.l[3] = 0;
                reply.xclient.data.l[4] = _glfw.x11.XdndActionCopy;

                XSendEvent(_glfw.x11.display, event->xclient.data.l[0],
                           False, NoEventMask, &reply);
                XFlush(_glfw.x11.display);
            }

            break;
        }

        case SelectionNotify:
        {
            if (event->xselection.property)
            {
                // The converted data from the drag operation has arrived
                char* data;
                const int result =
                    _glfwGetWindowProperty(event->xselection.requestor,
                                           event->xselection.property,
                                           event->xselection.target,
                                           (unsigned char**) &data);

                if (result)
                {
                    int i, count;
                    char** paths = parseUriList(data, &count);

                    _glfwInputDrop(window, count, (const char**) paths);

                    for (i = 0;  i < count;  i++)
                        free(paths[i]);
                    free(paths);
                }

                XFree(data);

                XEvent reply;
                memset(&reply, 0, sizeof(reply));

                reply.type = ClientMessage;
                reply.xclient.window = _glfw.x11.xdnd.source;
                reply.xclient.message_type = _glfw.x11.XdndFinished;
                reply.xclient.format = 32;
                reply.xclient.data.l[0] = window->x11.handle;
                reply.xclient.data.l[1] = result;
                reply.xclient.data.l[2] = _glfw.x11.XdndActionCopy;

                // Reply that all is well
                XSendEvent(_glfw.x11.display, _glfw.x11.xdnd.source,
                           False, NoEventMask, &reply);
                XFlush(_glfw.x11.display);
            }

            break;
        }

        case FocusIn:
        {
            if (event->xfocus.mode == NotifyNormal)
            {
                _glfwInputWindowFocus(window, GL_TRUE);

                if (window->cursorMode == GLFW_CURSOR_DISABLED)
                    disableCursor(window);
            }

            break;
        }

        case FocusOut:
        {
            if (event->xfocus.mode == NotifyNormal)
            {
                _glfwInputWindowFocus(window, GL_FALSE);

                if (window->cursorMode == GLFW_CURSOR_DISABLED)
                    restoreCursor(window);
            }

            break;
        }

        case Expose:
        {
            _glfwInputWindowDamage(window);
            break;
        }

        case PropertyNotify:
        {
            if (event->xproperty.atom == _glfw.x11.WM_STATE &&
                event->xproperty.state == PropertyNewValue)
            {
                const int state = getWindowState(window);
                if (state == IconicState)
                    _glfwInputWindowIconify(window, GL_TRUE);
                else if (state == NormalState)
                    _glfwInputWindowIconify(window, GL_FALSE);
            }

            break;
        }

        case SelectionClear:
        {
            handleSelectionClear(event);
            break;
        }

        case SelectionRequest:
        {
            handleSelectionRequest(event);
            break;
        }

        case DestroyNotify:
            return;

#if defined(_GLFW_HAS_XINPUT)
        case GenericEvent:
        {
            if (event->xcookie.extension == _glfw.x11.xi.majorOpcode &&
                XGetEventData(_glfw.x11.display, &event->xcookie))
            {
                if (event->xcookie.evtype == XI_Motion)
                {
                    XIDeviceEvent* data = (XIDeviceEvent*) event->xcookie.data;

                    window = findWindowByHandle(data->event);
                    if (window)
                    {
                        if (data->event_x != window->x11.warpPosX ||
                            data->event_y != window->x11.warpPosY)
                        {
                            // The cursor was moved by something other than GLFW

                            double x, y;

                            if (window->cursorMode == GLFW_CURSOR_DISABLED)
                            {
                                if (_glfw.focusedWindow != window)
                                    break;

                                x = data->event_x - window->x11.cursorPosX;
                                y = data->event_y - window->x11.cursorPosY;
                            }
                            else
                            {
                                x = data->event_x;
                                y = data->event_y;
                            }

                            _glfwInputCursorMotion(window, x, y);
                        }

                        window->x11.cursorPosX = data->event_x;
                        window->x11.cursorPosY = data->event_y;
                    }
                }
            }

            XFreeEventData(_glfw.x11.display, &event->xcookie);
            break;
        }
#endif /*_GLFW_HAS_XINPUT*/

        default:
        {
            switch (event->type - _glfw.x11.randr.eventBase)
            {
                case RRScreenChangeNotify:
                {
                    XRRUpdateConfiguration(event);
                    break;
                }
            }

            break;
        }
    }
}